

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# constexpr_if.cpp
# Opt level: O1

int main(int argc,char **argv)

{
  ostream *poVar1;
  time_t tVar2;
  tm *__tp;
  char *pcVar3;
  size_t sVar4;
  time_t time;
  string ANS;
  long local_58;
  char *local_50;
  long local_48;
  char local_40;
  undefined7 uStack_3f;
  
  local_48 = 0;
  local_40 = '\0';
  local_50 = &local_40;
  std::__cxx11::string::_M_replace((ulong)&local_50,0,(char *)0x0,0x102004);
  local_58 = CONCAT71(local_58._1_7_,10);
  poVar1 = std::__ostream_insert<char,std::char_traits<char>>
                     ((ostream *)&std::cout,(char *)&local_58,1);
  poVar1 = std::__ostream_insert<char,std::char_traits<char>>(poVar1,local_50,local_48);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar1 + -0x18) + (char)poVar1);
  std::ostream::put((char)poVar1);
  std::ostream::flush();
  local_58 = ::time((time_t *)0x0);
  tVar2 = ::time((time_t *)0x0);
  if (tVar2 == local_58) {
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout,"Runtime-Evaluated:\t",0x13);
    __tp = localtime(&local_58);
    pcVar3 = asctime(__tp);
    if (pcVar3 == (char *)0x0) {
      std::ios::clear((int)*(undefined8 *)(std::cout + -0x18) + 0x105058);
    }
    else {
      sVar4 = strlen(pcVar3);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,pcVar3,sVar4);
    }
  }
  if (argc == 4) {
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout,"Your CMD/Terminal Args (4) are: \"",0x21);
    pcVar3 = *argv;
    if (pcVar3 == (char *)0x0) {
      std::ios::clear((int)*(undefined8 *)(std::cout + -0x18) + 0x105058);
    }
    else {
      sVar4 = strlen(pcVar3);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,pcVar3,sVar4);
    }
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"\", \"",4);
    pcVar3 = argv[1];
    if (pcVar3 == (char *)0x0) {
      std::ios::clear((int)*(undefined8 *)(std::cout + -0x18) + 0x105058);
    }
    else {
      sVar4 = strlen(pcVar3);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,pcVar3,sVar4);
    }
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"\", \"",4);
    pcVar3 = argv[2];
    if (pcVar3 == (char *)0x0) {
      std::ios::clear((int)*(undefined8 *)(std::cout + -0x18) + 0x105058);
    }
    else {
      sVar4 = strlen(pcVar3);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,pcVar3,sVar4);
    }
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"\", and \"",8);
    pcVar3 = argv[3];
    if (pcVar3 == (char *)0x0) {
      std::ios::clear((int)*(undefined8 *)(std::cout + -0x18) + 0x105058);
    }
    else {
      sVar4 = strlen(pcVar3);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,pcVar3,sVar4);
    }
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"\".\n",3);
    std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + 'X');
    std::ostream::put('X');
    std::ostream::flush();
  }
  std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + 'X');
  std::ostream::put('X');
  std::ostream::flush();
  if (local_50 != &local_40) {
    operator_delete(local_50,CONCAT71(uStack_3f,local_40) + 1);
  }
  return 0;
}

Assistant:

int main(int argc, char* argv[]) {
	/*	An example of an if condition that can be 
		evaluated at compile-time. This will succeed
		with constexpr if as well as a regular if. */
	std::string ANS;
	if constexpr (9-9>2) ANS = "Compile-Time Evaluation with \'if constexpr\'.";
	else ANS = "Compile-Time Evaluation with \'if constexpr\'.";
	std::cout << '\n' << ANS << std::endl;

	/*	Two example of runtime evaluated conditions.
		These will fail with constexpr if but will
		succeed with regular if. */

	//The time is only known at runtime
	std::time_t time = std::time(NULL);
	//if constexpr (std::time (NULL) == time) {
	if (std::time (NULL) == time ) {
		std::cout << "Runtime-Evaluated:\t" <<
		std::asctime(std::localtime(&time));
	}
	//Args are only known at runtime
	//if constexpr (argc == 4) {
	if (argc == 4) {
		std::cout << "Your CMD/Terminal Args (4) are: \""
		<< argv[0] << "\", \"" << argv[1] << "\", \"" << argv[2]
		<< "\", and \"" << argv[3] << "\".\n" << std::endl;
	}
	std::cout << std::endl;
}